

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordEmbedding.pb.h
# Opt level: O1

bool CoreML::Specification::operator==(WordEmbedding *a,WordEmbedding *b)

{
  size_t sVar1;
  int iVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  
  if (a->revision_ != b->revision_) {
    return false;
  }
  puVar3 = (undefined8 *)((ulong)(a->language_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  puVar4 = (undefined8 *)((ulong)(b->language_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  sVar1 = puVar3[1];
  if ((sVar1 == puVar4[1]) &&
     ((sVar1 == 0 || (iVar2 = bcmp((void *)*puVar3,(void *)*puVar4,sVar1), iVar2 == 0)))) {
    puVar3 = (undefined8 *)((ulong)(a->modelparameterdata_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    sVar1 = puVar3[1];
    puVar4 = (undefined8 *)((ulong)(b->modelparameterdata_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    if ((sVar1 == puVar4[1]) &&
       ((sVar1 == 0 || (iVar2 = bcmp((void *)*puVar3,(void *)*puVar4,sVar1), iVar2 == 0)))) {
      return true;
    }
  }
  return false;
}

Assistant:

inline uint32_t WordEmbedding::_internal_revision() const {
  return revision_;
}